

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_4,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,3,4>
          (Matrix<float,_4,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_3> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix<float,_3,_4> *extraout_RDX;
  Matrix<float,_3,_4> *mat;
  Matrix<float,_3,_4> *extraout_RDX_00;
  int local_58;
  int local_54;
  int c;
  int r;
  Matrix<float,_3,_4> retVal;
  Vector<float,_3> *b_local;
  Vector<float,_4> *a_local;
  
  retVal.m_data.m_data[3].m_data._4_8_ = a;
  tcu::Matrix<float,_3,_4>::Matrix((Matrix<float,_3,_4> *)&c);
  mat = extraout_RDX;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_58);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_3>::operator[]
                         ((Vector<float,_3> *)retVal.m_data.m_data[3].m_data._4_8_,local_54);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_3,_4>::operator()((Matrix<float,_3,_4> *)&c,local_54,local_58);
      *pfVar3 = fVar1 * fVar2;
      mat = extraout_RDX_00;
    }
  }
  tcu::transpose<float,3,4>(__return_storage_ptr__,(tcu *)&c,mat);
  tcu::Matrix<float,_3,_4>::~Matrix((Matrix<float,_3,_4> *)&c);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}